

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateGLImpl::
DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)
::RESOURCE_DIMENSION_bool_
          (void *this,GLResourceAttribs *Attribs,RESOURCE_DIMENSION ResDim,bool IsMS)

{
  Uint32 ResIndex;
  array<Diligent::ShaderResourceCacheGL_*,_8UL> *this_00;
  PipelineResourceSignatureGLImpl *this_01;
  undefined8 ResourceCache;
  bool bVar1;
  reference this_02;
  pointer pRVar2;
  const_reference ppSVar3;
  Char *Message;
  char *ShaderName;
  char (*in_R8) [10];
  undefined1 local_48 [8];
  string msg;
  ShaderResourceCacheGL *pResourceCache;
  bool IsMS_local;
  RESOURCE_DIMENSION ResDim_local;
  GLResourceAttribs *Attribs_local;
  HandleResourceHelper *this_local;
  
  this_02 = __gnu_cxx::
            __normal_iterator<const_Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution_*,_std::vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>_>
            ::operator*((__normal_iterator<const_Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution_*,_std::vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>_>
                         *)((long)this + 0x10));
  bVar1 = PipelineStateBase::ResourceAttribution::operator_cast_to_bool
                    ((ResourceAttribution *)this_02);
  if (bVar1) {
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution_*,_std::vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>_>
             ::operator->((__normal_iterator<const_Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution_*,_std::vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>_>
                           *)((long)this + 0x10));
    bVar1 = PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution::IsImmutableSampler
                      (pRVar2);
    if (!bVar1) {
      this_00 = *(array<Diligent::ShaderResourceCacheGL_*,_8UL> **)((long)this + 8);
      pRVar2 = __gnu_cxx::
               __normal_iterator<const_Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution_*,_std::vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>_>
               ::operator->((__normal_iterator<const_Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution_*,_std::vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>_>
                             *)((long)this + 0x10));
      ppSVar3 = std::array<Diligent::ShaderResourceCacheGL_*,_8UL>::operator[]
                          (this_00,(ulong)pRVar2->SignatureIndex);
      msg.field_2._8_8_ = *ppSVar3;
      if ((value_type)msg.field_2._8_8_ == (value_type)0x0) {
        pRVar2 = __gnu_cxx::
                 __normal_iterator<const_Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution_*,_std::vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>_>
                 ::operator->((__normal_iterator<const_Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution_*,_std::vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>_>
                               *)((long)this + 0x10));
        FormatString<char[25],unsigned_int,char[10]>
                  ((string *)local_48,(Diligent *)"Resource cache at index ",
                   (char (*) [25])&pRVar2->SignatureIndex,(uint *)0x486c09,in_R8);
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"Validate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                   ,0x303);
        std::__cxx11::string::~string((string *)local_48);
      }
      pRVar2 = __gnu_cxx::
               __normal_iterator<const_Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution_*,_std::vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>_>
               ::operator->((__normal_iterator<const_Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution_*,_std::vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>_>
                             *)((long)this + 0x10));
      this_01 = pRVar2->pSignature;
      pRVar2 = __gnu_cxx::
               __normal_iterator<const_Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution_*,_std::vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>_>
               ::operator->((__normal_iterator<const_Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution_*,_std::vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>_>
                             *)((long)this + 0x10));
      ResourceCache = msg.field_2._8_8_;
      ResIndex = pRVar2->ResourceIndex;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(*this + 0xf8),(ulong)**(uint **)((long)this + 0x18));
      ShaderName = (char *)std::__cxx11::string::c_str();
      PipelineResourceSignatureGLImpl::DvpValidateCommittedResource
                (this_01,Attribs,ResDim,IsMS,ResIndex,(ShaderResourceCacheGL *)ResourceCache,
                 ShaderName,*(char **)(*this + 0x18));
    }
  }
  __gnu_cxx::
  __normal_iterator<const_Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution_*,_std::vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>_>
  ::operator++((__normal_iterator<const_Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution_*,_std::vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>_>
                *)((long)this + 0x10));
  return;
}

Assistant:

void Validate(const ShaderResourcesGL::GLResourceAttribs& Attribs, RESOURCE_DIMENSION ResDim, bool IsMS)
        {
            if (*attrib_it && !attrib_it->IsImmutableSampler())
            {
                const auto* pResourceCache = ResourceCaches[attrib_it->SignatureIndex];
                DEV_CHECK_ERR(pResourceCache != nullptr, "Resource cache at index ", attrib_it->SignatureIndex, " is null.");
                attrib_it->pSignature->DvpValidateCommittedResource(Attribs, ResDim, IsMS, attrib_it->ResourceIndex, *pResourceCache,
                                                                    PSO.m_ShaderNames[shader_ind].c_str(), PSO.m_Desc.Name);
            }
            ++attrib_it;
        }